

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall
notch::io::PlainTextNetworkReader::read_layer
          (PlainTextNetworkReader *this,istream *in,MakeNet *mknet)

{
  bool bVar1;
  runtime_error *prVar2;
  string local_150 [39];
  undefined1 local_129;
  string local_128 [32];
  Activation *local_108;
  Activation *afptr_1;
  string local_f8 [32];
  Activation *local_d8;
  Activation *afptr;
  string local_c8 [32];
  undefined1 local_a8 [8];
  Array b;
  Array w;
  allocator local_71;
  string local_70 [8];
  string activationTag;
  size_t local_50;
  size_t outputDim;
  size_t inputDim;
  string tag;
  MakeNet *mknet_local;
  istream *in_local;
  PlainTextNetworkReader *this_local;
  
  std::__cxx11::string::string((string *)&inputDim);
  outputDim = 0;
  local_50 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  core::std::valarray<float>::valarray((valarray<float> *)&b._M_data,0);
  core::std::valarray<float>::valarray((valarray<float> *)local_a8,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"layer:",(allocator *)((long)&afptr + 7));
  read_tag_value<std::__cxx11::string>
            (this,in,(string *)local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inputDim);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&afptr + 7));
  read_layer_config(this,in,&outputDim,&local_50,(string *)local_70,(Array *)&b._M_data,
                    (Array *)local_a8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &inputDim,"FullyConnectedLayer");
  if (bVar1) {
    local_d8 = getActivation(this,(string *)local_70);
    if (local_d8 == (Activation *)0x0) {
      afptr_1._7_1_ = 1;
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "unsupported activation: ");
      std::runtime_error::runtime_error(prVar2,local_f8);
      afptr_1._7_1_ = 0;
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    core::MakeNet::addFC(mknet,(Array *)&b._M_data,(Array *)local_a8,local_d8);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &inputDim,"ActivationLayer");
    if (bVar1) {
      local_108 = getActivation(this,(string *)local_70);
      if (local_108 == (Activation *)0x0) {
        local_129 = 1;
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((char *)local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "unsupported activation: ");
        std::runtime_error::runtime_error(prVar2,local_128);
        local_129 = 0;
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      core::MakeNet::addActivation(mknet,local_108);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &inputDim,"EuclideanLoss");
      if (bVar1) {
        core::MakeNet::addL2Loss(mknet);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&inputDim,"HingeLoss");
        if (bVar1) {
          core::MakeNet::addHingeLoss(mknet);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&inputDim,"SoftmaxWithLoss");
          if (!bVar1) {
            prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((char *)local_150,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "unsupported layer type: ");
            std::runtime_error::runtime_error(prVar2,local_150);
            __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          core::MakeNet::addSoftmax(mknet);
        }
      }
    }
  }
  core::std::valarray<float>::~valarray((valarray<float> *)local_a8);
  core::std::valarray<float>::~valarray((valarray<float> *)&b._M_data);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&inputDim);
  return;
}

Assistant:

void read_layer(std::istream &in, MakeNet &mknet) {
        std::string tag;
        size_t inputDim = 0;
        size_t outputDim = 0;
        std::string activationTag = "";
        Array w(0);
        Array b(0);
        read_tag_value<std::string>(in, "layer:", tag);
        read_layer_config(in, inputDim, outputDim, activationTag, w, b);
        if (tag == "FullyConnectedLayer") {
            auto afptr = getActivation(activationTag);
            if (afptr) {
                mknet.addFC(w, b, *afptr);
            } else {
                throw std::runtime_error("unsupported activation: " +activationTag);
            }
        } else if (tag == "ActivationLayer") {
            auto afptr = getActivation(activationTag);
            if (afptr) {
                mknet.addActivation(*afptr);
            } else {
                throw std::runtime_error("unsupported activation: " +activationTag);
            }
        } else if (tag == "EuclideanLoss") {
            mknet.addL2Loss();
        } else if (tag == "HingeLoss") {
            mknet.addHingeLoss();
        } else if (tag == "SoftmaxWithLoss") {
            mknet.addSoftmax();
        } else {
            throw std::runtime_error("unsupported layer type: " + tag);
        }
    }